

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanodetplus_pnnx.cpp
# Opt level: O2

void generate_proposals(Mat *pred,int stride,Mat *in_pad,float prob_threshold,
                       vector<Object,_std::allocator<Object>_> *objects)

{
  size_t sVar1;
  size_t sVar2;
  int *piVar3;
  long lVar4;
  int _w;
  Layer *pLVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  float *pfVar9;
  long lVar10;
  ulong uVar11;
  undefined4 *puVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  float pred_ltrb [4];
  Mat local_d8;
  float local_88;
  Option opt;
  
  uVar19 = (long)(pred->c + -0x50) / 4;
  _w = (int)uVar19;
  uVar15 = 0;
  uVar14 = (ulong)(uint)(_w * 4);
  if (_w * 4 < 1) {
    uVar14 = uVar15;
  }
  uVar19 = uVar19 & 0xffffffff;
  if (_w < 1) {
    uVar19 = uVar15;
  }
  uVar8 = (ulong)(uint)pred->w;
  if (pred->w < 1) {
    uVar8 = uVar15;
  }
  uVar16 = (ulong)(uint)pred->h;
  if (pred->h < 1) {
    uVar16 = uVar15;
  }
  for (; uVar15 != uVar16; uVar15 = uVar15 + 1) {
    local_88 = (float)((int)uVar15 * stride);
    lVar17 = 0;
    for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
      pfVar9 = (float *)(uVar15 * pred->elemsize * (long)pred->w + lVar17 + (long)pred->data);
      fVar20 = -3.4028235e+38;
      uVar18 = 0xffffffffffffffff;
      for (uVar11 = 0; uVar11 != 0x50; uVar11 = uVar11 + 1) {
        fVar21 = *pfVar9;
        if (fVar20 < fVar21) {
          uVar18 = uVar11;
        }
        uVar18 = uVar18 & 0xffffffff;
        if (fVar21 <= fVar20) {
          fVar21 = fVar20;
        }
        fVar20 = fVar21;
        pfVar9 = (float *)((long)pfVar9 + pred->elemsize * pred->cstep);
      }
      fVar20 = expf(-fVar20);
      fVar20 = 1.0 / (fVar20 + 1.0);
      if (0.4 <= fVar20) {
        local_d8.cstep = 0;
        local_d8.data = (void *)0x0;
        local_d8.refcount._0_4_ = 0;
        local_d8.refcount._4_4_ = 0;
        local_d8.elemsize._0_4_ = 0;
        local_d8.elemsize._4_4_ = 0;
        local_d8.elempack = 0;
        local_d8.h = 0;
        local_d8.d = 0;
        local_d8.c = 0;
        local_d8.allocator = (Allocator *)0x0;
        local_d8.dims = 0;
        local_d8.w = 0;
        ncnn::Mat::create(&local_d8,_w,4,4,(Allocator *)0x0);
        sVar1 = pred->elemsize;
        sVar2 = pred->cstep;
        puVar12 = (undefined4 *)
                  ((sVar2 * 0x50 + (long)pred->w * uVar15) * sVar1 + lVar17 + (long)pred->data);
        for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
          *(undefined4 *)((long)local_d8.data + uVar11 * 4) = *puVar12;
          puVar12 = (undefined4 *)((long)puVar12 + sVar2 * sVar1);
        }
        pLVar5 = ncnn::create_layer("Softmax");
        ncnn::ParamDict::ParamDict((ParamDict *)pred_ltrb);
        ncnn::ParamDict::set((ParamDict *)pred_ltrb,0,1);
        ncnn::ParamDict::set((ParamDict *)pred_ltrb,1,1);
        (*pLVar5->_vptr_Layer[2])(pLVar5,(ParamDict *)pred_ltrb);
        ncnn::Option::Option(&opt);
        opt.num_threads = 1;
        opt.use_packing_layout = false;
        (*pLVar5->_vptr_Layer[4])(pLVar5,&opt);
        (*pLVar5->_vptr_Layer[9])(pLVar5,&local_d8,&opt);
        (*pLVar5->_vptr_Layer[5])(pLVar5);
        (*pLVar5->_vptr_Layer[1])(pLVar5);
        ncnn::ParamDict::~ParamDict((ParamDict *)pred_ltrb);
        lVar10 = (long)local_d8.w;
        lVar4 = CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
        pvVar6 = local_d8.data;
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          fVar21 = 0.0;
          for (uVar11 = 0; uVar19 != uVar11; uVar11 = uVar11 + 1) {
            fVar21 = fVar21 + (float)(int)uVar11 * *(float *)((long)pvVar6 + uVar11 * 4);
          }
          pred_ltrb[lVar13] = fVar21 * (float)stride;
          pvVar6 = (void *)((long)pvVar6 + lVar10 * lVar4);
        }
        fVar21 = (float)((int)uVar7 * stride);
        opt._0_4_ = fVar21 - (float)pred_ltrb._0_8_;
        opt.num_threads = (int)(local_88 - SUB84(pred_ltrb._0_8_,4));
        opt.blob_allocator._0_4_ = ((float)pred_ltrb._8_8_ + fVar21) - (float)opt._0_4_;
        opt.blob_allocator._4_4_ = (SUB84(pred_ltrb._8_8_,4) + local_88) - (float)opt.num_threads;
        opt.workspace_allocator._0_4_ = (undefined4)uVar18;
        opt.workspace_allocator._4_4_ = fVar20;
        std::vector<Object,_std::allocator<Object>_>::push_back
                  ((vector<Object,_std::allocator<Object>_> *)in_pad,(value_type *)&opt);
        piVar3 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_d8.allocator == (Allocator *)0x0) {
              free(local_d8.data);
            }
            else {
              (*(local_d8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      lVar17 = lVar17 + 4;
    }
  }
  return;
}

Assistant:

static void generate_proposals(const ncnn::Mat& pred, int stride, const ncnn::Mat& in_pad, float prob_threshold, std::vector<Object>& objects)
{
    const int num_grid = pred.h;

    int num_grid_x = pred.w;
    int num_grid_y = pred.h;

    const int num_class = 80; // number of classes. 80 for COCO
    const int reg_max_1 = (pred.c - num_class) / 4;

    for (int i = 0; i < num_grid_y; i++)
    {
        for (int j = 0; j < num_grid_x; j++)
        {
            // find label with max score
            int label = -1;
            float score = -FLT_MAX;
            for (int k = 0; k < num_class; k++)
            {
                float s = pred.channel(k).row(i)[j];
                if (s > score)
                {
                    label = k;
                    score = s;
                }
            }

            score = sigmoid(score);

            if (score >= prob_threshold)
            {
                ncnn::Mat bbox_pred(reg_max_1, 4);
                for (int k = 0; k < reg_max_1 * 4; k++)
                {
                    bbox_pred[k] = pred.channel(num_class + k).row(i)[j];
                }
                {
                    ncnn::Layer* softmax = ncnn::create_layer("Softmax");

                    ncnn::ParamDict pd;
                    pd.set(0, 1); // axis
                    pd.set(1, 1);
                    softmax->load_param(pd);

                    ncnn::Option opt;
                    opt.num_threads = 1;
                    opt.use_packing_layout = false;

                    softmax->create_pipeline(opt);

                    softmax->forward_inplace(bbox_pred, opt);

                    softmax->destroy_pipeline(opt);

                    delete softmax;
                }

                float pred_ltrb[4];
                for (int k = 0; k < 4; k++)
                {
                    float dis = 0.f;
                    const float* dis_after_sm = bbox_pred.row(k);
                    for (int l = 0; l < reg_max_1; l++)
                    {
                        dis += l * dis_after_sm[l];
                    }

                    pred_ltrb[k] = dis * stride;
                }

                float pb_cx = j * stride;
                float pb_cy = i * stride;

                float x0 = pb_cx - pred_ltrb[0];
                float y0 = pb_cy - pred_ltrb[1];
                float x1 = pb_cx + pred_ltrb[2];
                float y1 = pb_cy + pred_ltrb[3];

                Object obj;
                obj.rect.x = x0;
                obj.rect.y = y0;
                obj.rect.width = x1 - x0;
                obj.rect.height = y1 - y0;
                obj.label = label;
                obj.prob = score;

                objects.push_back(obj);
            }
        }
    }
}